

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

Test * BuildWithDepsLogTestStraightforward::Create(void)

{
  BuildTest *this;
  
  this = (BuildTest *)operator_new(0x4a8);
  BuildTest::BuildTest(this);
  this[1].super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&this[1].super_StateTestWithBuiltinRules.state_;
  this[1].super_StateTestWithBuiltinRules.super_Test.failed_ = false;
  *(undefined3 *)&this[1].super_StateTestWithBuiltinRules.super_Test.field_0x9 = 0;
  this[1].super_StateTestWithBuiltinRules.super_Test.assertion_failures_ = 0;
  *(undefined1 *)&this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_buckets = 0;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       &this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_rehash_policy;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_element_count = 0;
  *(undefined1 *)
   &this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_rehash_policy._M_max_load_factor =
       0;
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithDepsLogTest_001f6218;
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&DAT_001f6258;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(BuildWithDepsLogTest, Straightforward) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    fs_.Create("in1.d", "out: in2");
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // The deps file should have been removed.
    EXPECT_EQ(0, fs_.Stat("in1.d", &err));
    // Recreate it for the next step.
    fs_.Create("in1.d", "out: in2");
    deps_log.Close();
    builder.command_runner_.release();
  }

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Touch the file only mentioned in the deps.
    fs_.Tick();
    fs_.Create("in2", "");

    // Run the build again.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to in2 being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}